

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::InnerProduct3D_1D::backward_impl
          (InnerProduct3D_1D *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  Tensor *pTVar1;
  float *pfVar2;
  StoragePointerType pfVar3;
  Assign assign;
  Assign assign_1;
  DefaultDevice local_b9;
  type local_b8;
  type local_a8;
  type local_88;
  
  if ((dEdf->d).nd != 2) {
    __assert_fail("d.ndims() == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/clab[P]att-coref/cnn/cnn/tensor.h"
                  ,0xb8,"const Eigen::TensorMap<Eigen::Tensor<float, 2>> cnn::Tensor::t() const");
  }
  local_88.m_rhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = (long)dEdf->v;
  local_88.m_rhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[1] =
       (long)(int)(dEdf->d).d[0];
  local_88.m_rhs_xpr.m_rhs_xpr.m_data = (StoragePointerType)(long)(int)(dEdf->d).d[1];
  if (i == 2) {
    if ((dEdxi->d).nd != 2) {
      __assert_fail("d.ndims() == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/clab[P]att-coref/cnn/cnn/tensor.h"
                    ,0xb4,"Eigen::TensorMap<Eigen::Tensor<float, 2>> cnn::Tensor::t()");
    }
    local_a8.m_data = dEdxi->v;
    local_a8.m_dimensions.super_array<long,_3>._M_elems[0] = (long)(int)(dEdxi->d).d[0];
    local_a8.m_dimensions.super_array<long,_3>._M_elems[1] = (long)(int)(dEdxi->d).d[1];
    local_b8.m_data = (StoragePointerType)&local_a8;
    local_b8.m_dimensions.super_array<long,_1>._M_elems[0] = (array<long,_1>)&local_88;
    local_88.m_lhs_xpr.m_data = local_a8.m_data;
    local_88.m_lhs_xpr.m_dimensions.super_array<long,_1>._M_elems[0] =
         (array<long,_1>)(array<long,_1>)local_a8.m_dimensions.super_array<long,_3>._M_elems[0];
    local_88.m_rhs_xpr.m_lhs_xpr.m_data =
         (StoragePointerType)local_a8.m_dimensions.super_array<long,_3>._M_elems[1];
    Eigen::internal::
    TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)0>
    ::run((TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>
           *)&local_b8,&local_b9);
  }
  else if (i == 1) {
    pTVar1 = *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if ((pTVar1->d).nd != 3) {
      __assert_fail("d.ndims() == 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/clab[P]att-coref/cnn/cnn/tensor.h"
                    ,0xc0,"const Eigen::TensorMap<Eigen::Tensor<float, 3>> cnn::Tensor::t() const");
    }
    if ((dEdxi->d).nd != 1) {
      __assert_fail("d.ndims() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/clab[P]att-coref/cnn/cnn/tensor.h"
                    ,0xac,"Eigen::TensorMap<Eigen::Tensor<float, 1>> cnn::Tensor::t()");
    }
    local_88.m_rhs_xpr.m_rhs_xpr.m_dimensions.super_array<long,_3>._M_elems[0] =
         (long)(int)(pTVar1->d).d[0];
    local_88.m_rhs_xpr.m_rhs_xpr.m_dimensions.super_array<long,_3>._M_elems[1] =
         (long)(int)(pTVar1->d).d[1];
    local_88.m_rhs_xpr.m_rhs_xpr.m_dimensions.super_array<long,_3>._M_elems[2] =
         (long)(int)(pTVar1->d).d[2];
    local_b8.m_data = dEdxi->v;
    local_b8.m_dimensions.super_array<long,_1>._M_elems[0] =
         (array<long,_1>)(long)(int)(dEdxi->d).d[0];
    local_a8.m_data = (StoragePointerType)&local_b8;
    local_a8.m_dimensions.super_array<long,_3>._M_elems[0] = (long)&local_88;
    local_88.m_rhs_xpr.m_indices._M_elems[0].first = 0;
    local_88.m_rhs_xpr.m_indices._M_elems[0].second = 0;
    local_88.m_rhs_xpr.m_indices._M_elems[1].first = 1;
    local_88.m_rhs_xpr.m_indices._M_elems[1].second = 1;
    local_88.m_lhs_xpr.m_data = local_b8.m_data;
    local_88.m_lhs_xpr.m_dimensions.super_array<long,_1>._M_elems[0] =
         local_b8.m_dimensions.super_array<long,_1>._M_elems[0];
    local_88.m_rhs_xpr.m_lhs_xpr.m_data =
         (StoragePointerType)
         local_88.m_rhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[0];
    local_88.m_rhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[0] =
         local_88.m_rhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[1];
    local_88.m_rhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[1] =
         (long)local_88.m_rhs_xpr.m_rhs_xpr.m_data;
    local_88.m_rhs_xpr.m_rhs_xpr.m_data = pTVar1->v;
    Eigen::internal::
    TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)0>
    ::run((TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>_>_>
           *)&local_a8,&local_b9);
  }
  else {
    if (i != 0) {
      std::operator<<((ostream *)&std::cerr,"shouldn\'t happen\n");
      abort();
    }
    pTVar1 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
             _M_impl.super__Vector_impl_data._M_start[1];
    if ((pTVar1->d).nd != 1) {
      __assert_fail("d.ndims() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/clab[P]att-coref/cnn/cnn/tensor.h"
                    ,0xb0,"const Eigen::TensorMap<Eigen::Tensor<float, 1>> cnn::Tensor::t() const");
    }
    if ((dEdxi->d).nd != 3) {
      __assert_fail("d.ndims() == 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/clab[P]att-coref/cnn/cnn/tensor.h"
                    ,0xbc,"Eigen::TensorMap<Eigen::Tensor<float, 3>> cnn::Tensor::t()");
    }
    local_88.m_rhs_xpr.m_rhs_xpr.m_dimensions.super_array<long,_3>._M_elems[1] = (long)pTVar1->v;
    local_88.m_rhs_xpr.m_rhs_xpr.m_dimensions.super_array<long,_3>._M_elems[2] =
         (long)(int)(pTVar1->d).d[0];
    local_a8.m_data = dEdxi->v;
    local_a8.m_dimensions.super_array<long,_3>._M_elems[0] = (long)(int)(dEdxi->d).d[0];
    local_a8.m_dimensions.super_array<long,_3>._M_elems[1] = (long)(int)(dEdxi->d).d[1];
    local_a8.m_dimensions.super_array<long,_3>._M_elems[2] = (long)(int)(dEdxi->d).d[2];
    local_b8.m_data = (StoragePointerType)&local_a8;
    local_b8.m_dimensions.super_array<long,_1>._M_elems[0] = (array<long,_1>)&local_88;
    local_88.m_lhs_xpr.m_data = local_a8.m_data;
    local_88.m_lhs_xpr.m_dimensions.super_array<long,_1>._M_elems[0] =
         (array<long,_1>)(array<long,_1>)local_a8.m_dimensions.super_array<long,_3>._M_elems[0];
    local_88.m_rhs_xpr.m_lhs_xpr.m_data =
         (StoragePointerType)local_a8.m_dimensions.super_array<long,_3>._M_elems[1];
    pfVar2 = (float *)local_88.m_rhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[0];
    local_88.m_rhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[0] =
         local_a8.m_dimensions.super_array<long,_3>._M_elems[2];
    pfVar3 = (StoragePointerType)
             local_88.m_rhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[1];
    local_88.m_rhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[1] = (long)pfVar2;
    local_88.m_rhs_xpr.m_rhs_xpr.m_dimensions.super_array<long,_3>._M_elems[0] =
         (long)local_88.m_rhs_xpr.m_rhs_xpr.m_data;
    local_88.m_rhs_xpr.m_rhs_xpr.m_data = pfVar3;
    Eigen::internal::
    TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_0UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)0>
    ::run((TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_0UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>_>_>
           *)&local_b8,&local_b9);
  }
  return;
}

Assistant:

void MatrixInverse::backward_impl(const vector<const Tensor*>& xs,
                                  const Tensor& fx,
                                  const Tensor& dEdf,
                                  unsigned i,
                                  Tensor& dEdxi) const {
  assert(xs.size() == 1);
#ifdef HAVE_CUDA
  throw std::runtime_error("MatrixInverse not yet implemented for CUDA");
#else
  auto d = *dEdf;
  auto y = *fx;
  (*dEdxi) -= y * d * y;
#endif
}